

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
GdlRenderer::DebugXmlClasses(GdlRenderer *this,ofstream *strmOut,string *staPathToCur)

{
  ulong uVar1;
  bool bVar2;
  size_type_conflict sVar3;
  reference ppGVar4;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  int *unaff_retaddr;
  ofstream *in_stack_00000008;
  GdlGlyphClassDefn *in_stack_00000010;
  size_t ipglfc;
  int cwGlyphIDs;
  value_type in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  string local_78 [48];
  string local_48 [32];
  ulong local_28;
  undefined4 local_1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  string *staPathToCur_00;
  
  local_10 = in_RSI;
  staPathToCur_00 = in_RDI;
  std::operator<<((ostream *)in_RSI,"  <classes>\n");
  for (local_28 = 0; uVar1 = local_28,
      sVar3 = std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::size
                        ((vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *)
                         (in_RDI + 0x40)), uVar1 < sVar3; local_28 = local_28 + 1) {
    std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::operator[]
              ((vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *)(in_RDI + 0x40),
               local_28);
    GdlGlyphClassDefn::Name_abi_cxx11_(in_stack_ffffffffffffff48);
    bVar2 = std::operator==(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    std::__cxx11::string::~string(local_48);
    if (!bVar2) {
      local_1c = 0;
      ppGVar4 = std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::operator[]
                          ((vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *)
                           (in_RDI + 0x40),local_28);
      in_stack_ffffffffffffff48 = *ppGVar4;
      in_stack_ffffffffffffff50 = local_10;
      std::__cxx11::string::string(local_78,in_RDX);
      GdlGlyphClassDefn::DebugXmlClasses
                (in_stack_00000010,in_stack_00000008,unaff_retaddr,staPathToCur_00);
      std::__cxx11::string::~string(local_78);
    }
  }
  std::operator<<((ostream *)local_10,"  </classes>\n\n");
  return;
}

Assistant:

void GdlRenderer::DebugXmlClasses(std::ofstream & strmOut, std::string staPathToCur)		
{
	strmOut << "  <classes>\n";

	int cwGlyphIDs;
	for (size_t ipglfc = 0; ipglfc < m_vpglfc.size(); ipglfc++)
	{
		if (m_vpglfc[ipglfc]->Name() == "ANY")
			continue;

		cwGlyphIDs = 0;
		m_vpglfc[ipglfc]->DebugXmlClasses(strmOut, cwGlyphIDs, staPathToCur);
	}

	strmOut << "  </classes>\n\n";
}